

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.h
# Opt level: O0

bool google::protobuf::internal::
     AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>>
               (RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *t)

{
  bool bVar1;
  UninterpretedOption_NamePart *this;
  int local_1c;
  int i;
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *t_local;
  
  local_1c = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::size(t);
  do {
    local_1c = local_1c + -1;
    if (local_1c < 0) {
      return true;
    }
    this = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Get(t,local_1c);
    bVar1 = UninterpretedOption_NamePart::IsInitialized(this);
  } while (bVar1);
  return false;
}

Assistant:

bool AllAreInitialized(const Type& t) {
  for (int i = t.size(); --i >= 0; ) {
    if (!t.Get(i).IsInitialized()) return false;
  }
  return true;
}